

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qsysinfo.cpp
# Opt level: O1

bool readEtcFile(QUnixOSVersion *v,char *filename,QByteArray *idKey,QByteArray *versionKey,
                QByteArray *prettyNameKey)

{
  long lVar1;
  QArrayData *pQVar2;
  char16_t *pcVar3;
  char *pcVar4;
  qsizetype qVar5;
  bool bVar6;
  char *pcVar7;
  char *pcVar8;
  qsizetype qVar9;
  char *pcVar10;
  QString *pQVar11;
  char *pcVar12;
  long in_FS_OFFSET;
  QByteArrayView needle;
  QByteArrayView ba;
  QByteArrayView needle_00;
  QByteArrayView ba_00;
  QByteArrayView needle_01;
  QByteArrayView ba_01;
  QByteArrayView haystack;
  QByteArrayView haystack_00;
  QByteArrayView haystack_01;
  QString local_98;
  QByteArray local_78;
  QByteArray local_58;
  long local_38;
  
  local_38 = *(long *)(in_FS_OFFSET + 0x28);
  local_58.d.size = (qsizetype)&DAT_aaaaaaaaaaaaaaaa;
  local_58.d.d = (Data *)&DAT_aaaaaaaaaaaaaaaa;
  local_58.d.ptr = &DAT_aaaaaaaaaaaaaaaa;
  getEtcFileContent(&local_58,filename);
  qVar5 = local_58.d.size;
  if ((undefined1 *)local_58.d.size != (undefined1 *)0x0) {
    pcVar12 = local_58.d.ptr;
    if (local_58.d.ptr == (char *)0x0) {
      pcVar12 = "";
    }
    pcVar10 = local_58.d.ptr + local_58.d.size;
    local_78.d.d = (Data *)0x0;
    local_78.d.ptr = (storage_type *)0x0;
    local_78.d.size = 0;
    if (pcVar12 != pcVar10) {
      do {
        pcVar7 = (char *)memchr(pcVar12,10,(long)pcVar10 - (long)pcVar12);
        if (pcVar7 == (char *)0x0) {
          pcVar7 = pcVar10 + -1;
        }
        QByteArray::setRawData(&local_78,pcVar12,(long)pcVar7 - (long)pcVar12);
        qVar9 = local_78.d.size;
        pcVar4 = local_78.d.ptr;
        pcVar8 = (idKey->d).ptr;
        lVar1 = (idKey->d).size;
        needle.m_data = pcVar8;
        needle.m_size = lVar1;
        haystack.m_data = local_78.d.ptr;
        haystack.m_size = local_78.d.size;
        bVar6 = QtPrivate::startsWith(haystack,needle);
        if (bVar6) {
          pcVar12 = pcVar12 + lVar1;
          pQVar11 = (QString *)(pcVar7 + -(long)pcVar12);
          if (((1 < (long)pQVar11) && (*pcVar12 == '\"')) && ((pcVar12 + -1)[(long)pQVar11] == '\"')
             ) {
            pcVar12 = pcVar12 + 1;
            pQVar11 = (QString *)((long)&pQVar11[-1].d.size + 6);
          }
          ba.m_data = pcVar8;
          ba.m_size = (qsizetype)pcVar12;
          QString::fromUtf8(&local_98,pQVar11,ba);
          pQVar2 = &((v->productType).d.d)->super_QArrayData;
          pcVar3 = (v->productType).d.ptr;
          (v->productType).d.d = local_98.d.d;
          (v->productType).d.ptr = local_98.d.ptr;
          qVar9 = (v->productType).d.size;
          (v->productType).d.size = local_98.d.size;
          local_98.d.d = (Data *)pQVar2;
          local_98.d.ptr = pcVar3;
LAB_00219c0a:
          local_98.d.size = qVar9;
          if (&(local_98.d.d)->super_QArrayData != (QArrayData *)0x0) {
            LOCK();
            ((local_98.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
                 ((local_98.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i + -1
            ;
            UNLOCK();
            if (((local_98.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i == 0)
            {
              QArrayData::deallocate(&(local_98.d.d)->super_QArrayData,2,0x10);
            }
          }
        }
        else {
          pcVar8 = (prettyNameKey->d).ptr;
          lVar1 = (prettyNameKey->d).size;
          needle_00.m_data = pcVar8;
          needle_00.m_size = lVar1;
          haystack_00.m_data = pcVar4;
          haystack_00.m_size = qVar9;
          bVar6 = QtPrivate::startsWith(haystack_00,needle_00);
          if (bVar6) {
            pcVar12 = pcVar12 + lVar1;
            pQVar11 = (QString *)(pcVar7 + -(long)pcVar12);
            if (((1 < (long)pQVar11) && (*pcVar12 == '\"')) &&
               ((pcVar12 + -1)[(long)pQVar11] == '\"')) {
              pcVar12 = pcVar12 + 1;
              pQVar11 = (QString *)((long)&pQVar11[-1].d.size + 6);
            }
            ba_00.m_data = pcVar8;
            ba_00.m_size = (qsizetype)pcVar12;
            QString::fromUtf8(&local_98,pQVar11,ba_00);
            pQVar2 = &((v->prettyName).d.d)->super_QArrayData;
            pcVar3 = (v->prettyName).d.ptr;
            (v->prettyName).d.d = local_98.d.d;
            (v->prettyName).d.ptr = local_98.d.ptr;
            qVar9 = (v->prettyName).d.size;
            (v->prettyName).d.size = local_98.d.size;
            local_98.d.d = (Data *)pQVar2;
            local_98.d.ptr = pcVar3;
            goto LAB_00219c0a;
          }
          pcVar8 = (versionKey->d).ptr;
          lVar1 = (versionKey->d).size;
          needle_01.m_data = pcVar8;
          needle_01.m_size = lVar1;
          haystack_01.m_data = pcVar4;
          haystack_01.m_size = qVar9;
          bVar6 = QtPrivate::startsWith(haystack_01,needle_01);
          if (bVar6) {
            pcVar12 = pcVar12 + lVar1;
            pQVar11 = (QString *)(pcVar7 + -(long)pcVar12);
            if (((1 < (long)pQVar11) && (*pcVar12 == '\"')) &&
               ((pcVar12 + -1)[(long)pQVar11] == '\"')) {
              pcVar12 = pcVar12 + 1;
              pQVar11 = (QString *)((long)&pQVar11[-1].d.size + 6);
            }
            ba_01.m_data = pcVar8;
            ba_01.m_size = (qsizetype)pcVar12;
            QString::fromUtf8(&local_98,pQVar11,ba_01);
            pQVar2 = &((v->productVersion).d.d)->super_QArrayData;
            pcVar3 = (v->productVersion).d.ptr;
            (v->productVersion).d.d = local_98.d.d;
            (v->productVersion).d.ptr = local_98.d.ptr;
            qVar9 = (v->productVersion).d.size;
            (v->productVersion).d.size = local_98.d.size;
            local_98.d.d = (Data *)pQVar2;
            local_98.d.ptr = pcVar3;
            goto LAB_00219c0a;
          }
        }
        pcVar12 = pcVar7 + 1;
      } while (pcVar12 != pcVar10);
    }
    if (&(local_78.d.d)->super_QArrayData != (QArrayData *)0x0) {
      LOCK();
      ((local_78.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
           ((local_78.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i + -1;
      UNLOCK();
      if (((local_78.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i == 0) {
        QArrayData::deallocate(&(local_78.d.d)->super_QArrayData,1,0x10);
      }
    }
  }
  if (&(local_58.d.d)->super_QArrayData != (QArrayData *)0x0) {
    LOCK();
    ((local_58.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
         ((local_58.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i + -1;
    UNLOCK();
    if (((local_58.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i == 0) {
      QArrayData::deallocate(&(local_58.d.d)->super_QArrayData,1,0x10);
    }
  }
  if (*(long *)(in_FS_OFFSET + 0x28) != local_38) {
    __stack_chk_fail();
  }
  return (undefined1 *)qVar5 != (undefined1 *)0x0;
}

Assistant:

static bool readEtcFile(QUnixOSVersion &v, const char *filename,
                        const QByteArray &idKey, const QByteArray &versionKey, const QByteArray &prettyNameKey)
{

    QByteArray buffer = getEtcFileContent(filename);
    if (buffer.isEmpty())
        return false;

    const char *ptr = buffer.constData();
    const char *end = buffer.constEnd();
    const char *eol;
    QByteArray line;
    for (; ptr != end; ptr = eol + 1) {
        // find the end of the line after ptr
        eol = static_cast<const char *>(memchr(ptr, '\n', end - ptr));
        if (!eol)
            eol = end - 1;
        line.setRawData(ptr, eol - ptr);

        if (line.startsWith(idKey)) {
            ptr += idKey.size();
            v.productType = unquote({ptr, eol});
            continue;
        }

        if (line.startsWith(prettyNameKey)) {
            ptr += prettyNameKey.size();
            v.prettyName = unquote({ptr, eol});
            continue;
        }

        if (line.startsWith(versionKey)) {
            ptr += versionKey.size();
            v.productVersion = unquote({ptr, eol});
            continue;
        }
    }

    return true;
}